

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptStruct(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  bool bVar1;
  bool bVar2;
  EHlslTokenClass tokenClass;
  uint uVar3;
  size_type sVar4;
  TSymbol *pTVar5;
  TType *pTVar6;
  size_type sVar7;
  reference pvVar8;
  int local_f8;
  int b_1;
  bool deferredSuccess;
  int b;
  bool acceptedList;
  TVector<glslang::TFunctionDeclarator> functionDeclarators;
  TTypeList *typeList;
  undefined1 local_b8 [7];
  bool postDeclsFound;
  TQualifier postDeclQualifier;
  undefined1 local_60 [8];
  TString structName;
  char *idString;
  bool readonly;
  TStorageQualifier storageQualifier;
  TIntermNode **nodeList_local;
  TType *type_local;
  HlslGrammar *this_local;
  
  idString._4_4_ = 0;
  idString._3_1_ = 0;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokCBuffer);
  if (bVar1) {
    idString._4_4_ = 5;
  }
  else {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTBuffer);
    if (bVar1) {
      idString._4_4_ = 6;
      idString._3_1_ = 1;
    }
    else {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokClass);
      if ((!bVar1) &&
         (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokStruct),
         !bVar1)) {
        return false;
      }
    }
  }
  tokenClass = HlslTokenStream::peek(&this->super_HlslTokenStream);
  structName.field_2._8_8_ = getTypeString(this,tokenClass);
  pool_allocator<char>::pool_allocator
            ((pool_allocator<char> *)&postDeclQualifier.layoutBindlessSampler);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_60,"",
             (pool_allocator<char> *)&postDeclQualifier.layoutBindlessSampler);
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIdentifier);
  if ((bVar1) || (structName.field_2._8_8_ != 0)) {
    if (structName.field_2._8_8_ == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_60,(this->super_HlslTokenStream).token.field_2.string);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_60,*(char *)structName.field_2._8_8_);
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  TQualifier::clear((TQualifier *)local_b8);
  bVar1 = acceptPostDecls(this,(TQualifier *)local_b8);
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar2) {
    TVector<glslang::TFunctionDeclarator>::TVector((TVector<glslang::TFunctionDeclarator> *)&b);
    HlslParseContext::pushNamespace(this->parseContext,(TString *)local_60);
    bVar1 = acceptStructDeclarationList
                      (this,(TTypeList **)
                            &functionDeclarators.
                             super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                             .
                             super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,nodeList,
                       (TVector<glslang::TFunctionDeclarator> *)&b);
    HlslParseContext::popNamespace(this->parseContext);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
      if (bVar1) {
        if (idString._4_4_ == 0) {
          pTVar6 = (TType *)TType::operator_new(0x98,type);
          TType::TType(pTVar6,(TTypeList *)
                              functionDeclarators.
                              super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                              .
                              super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(TString *)local_60
                      );
        }
        else {
          postDeclQualifier.semanticName =
               (char *)((ulong)postDeclQualifier.semanticName & 0xffff7fffffffff80 |
                        (ulong)idString._4_4_ | (ulong)idString._3_1_ << 0x2f);
          pTVar6 = (TType *)TType::operator_new(0x98,type);
          TType::TType(pTVar6,(TTypeList *)
                              functionDeclarators.
                              super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                              .
                              super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(TString *)local_60
                       ,(TQualifier *)local_b8);
        }
        HlslParseContext::declareStruct
                  (this->parseContext,&(this->super_HlslTokenStream).token.loc,(TString *)local_60,
                   type);
        for (b_1 = 0; sVar7 = std::
                              vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                              ::size((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                      *)&b), b_1 < (int)sVar7; b_1 = b_1 + 1) {
          pvVar8 = std::
                   vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                   ::operator[]((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 *)&b,(long)b_1);
          uVar3 = (*(pvVar8->function->super_TSymbol)._vptr_TSymbol[0x21])();
          if ((uVar3 & 1) != 0) {
            pvVar8 = std::
                     vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                     ::operator[]((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   *)&b,(long)b_1);
            (*(pvVar8->function->super_TSymbol)._vptr_TSymbol[0x17])
                      (pvVar8->function,type,this->intermediate->implicitThisName);
          }
        }
        HlslParseContext::pushNamespace(this->parseContext,(TString *)local_60);
        HlslParseContext::pushThisScope
                  (this->parseContext,type,(TVector<glslang::TFunctionDeclarator> *)&b);
        bVar1 = true;
        local_f8 = 0;
        while( true ) {
          sVar7 = std::
                  vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                  ::size((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                          *)&b);
          bVar2 = false;
          if (local_f8 < (int)sVar7) {
            bVar2 = bVar1;
          }
          if (!bVar2) break;
          pvVar8 = std::
                   vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                   ::operator[]((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 *)&b,(long)local_f8);
          HlslTokenStream::pushTokenStream(&this->super_HlslTokenStream,pvVar8->body);
          pvVar8 = std::
                   vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                   ::operator[]((vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 *)&b,(long)local_f8);
          bVar2 = acceptFunctionBody(this,pvVar8,nodeList);
          if (!bVar2) {
            bVar1 = false;
          }
          HlslTokenStream::popTokenStream(&this->super_HlslTokenStream);
          local_f8 = local_f8 + 1;
        }
        HlslParseContext::popThisScope(this->parseContext);
        HlslParseContext::popNamespace(this->parseContext);
      }
      else {
        expected(this,"}");
        bVar1 = false;
      }
    }
    else {
      expected(this,"struct member declarations");
      bVar1 = false;
    }
    TVector<glslang::TFunctionDeclarator>::~TVector((TVector<glslang::TFunctionDeclarator> *)&b);
  }
  else {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::size((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_60);
    if (((sVar4 == 0) || (bVar1)) ||
       (pTVar5 = HlslParseContext::lookupUserType(this->parseContext,(TString *)local_60,type),
       pTVar5 == (TSymbol *)0x0)) {
      expected(this,"{");
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_60);
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptStruct(TType& type, TIntermNode*& nodeList)
{
    // This storage qualifier will tell us whether it's an AST
    // block type or just a generic structure type.
    TStorageQualifier storageQualifier = EvqTemporary;
    bool readonly = false;

    if (acceptTokenClass(EHTokCBuffer)) {
        // CBUFFER
        storageQualifier = EvqUniform;
    } else if (acceptTokenClass(EHTokTBuffer)) {
        // TBUFFER
        storageQualifier = EvqBuffer;
        readonly = true;
    } else if (! acceptTokenClass(EHTokClass) && ! acceptTokenClass(EHTokStruct)) {
        // Neither CLASS nor STRUCT
        return false;
    }

    // Now known to be one of CBUFFER, TBUFFER, CLASS, or STRUCT


    // IDENTIFIER.  It might also be a keyword which can double as an identifier.
    // For example:  'cbuffer ConstantBuffer' or 'struct ConstantBuffer' is legal.
    // 'cbuffer int' is also legal, and 'struct int' appears rejected only because
    // it attempts to redefine the 'int' type.
    const char* idString = getTypeString(peek());
    TString structName = "";
    if (peekTokenClass(EHTokIdentifier) || idString != nullptr) {
        if (idString != nullptr)
            structName = *idString;
        else
            structName = *token.string;
        advanceToken();
    }

    // post_decls
    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    bool postDeclsFound = acceptPostDecls(postDeclQualifier);

    // LEFT_BRACE, or
    // struct_type IDENTIFIER
    if (! acceptTokenClass(EHTokLeftBrace)) {
        if (structName.size() > 0 && !postDeclsFound && parseContext.lookupUserType(structName, type) != nullptr) {
            // struct_type IDENTIFIER
            return true;
        } else {
            expected("{");
            return false;
        }
    }


    // struct_declaration_list
    TTypeList* typeList;
    // Save each member function so they can be processed after we have a fully formed 'this'.
    TVector<TFunctionDeclarator> functionDeclarators;

    parseContext.pushNamespace(structName);
    bool acceptedList = acceptStructDeclarationList(typeList, nodeList, functionDeclarators);
    parseContext.popNamespace();

    if (! acceptedList) {
        expected("struct member declarations");
        return false;
    }

    // RIGHT_BRACE
    if (! acceptTokenClass(EHTokRightBrace)) {
        expected("}");
        return false;
    }

    // create the user-defined type
    if (storageQualifier == EvqTemporary)
        new(&type) TType(typeList, structName);
    else {
        postDeclQualifier.storage = storageQualifier;
        postDeclQualifier.readonly = readonly;
        new(&type) TType(typeList, structName, postDeclQualifier); // sets EbtBlock
    }

    parseContext.declareStruct(token.loc, structName, type);

    // For member functions: now that we know the type of 'this', go back and
    // - add their implicit argument with 'this' (not to the mangling, just the argument list)
    // - parse the functions, their tokens were saved for deferred parsing (now)
    for (int b = 0; b < (int)functionDeclarators.size(); ++b) {
        // update signature
        if (functionDeclarators[b].function->hasImplicitThis())
            functionDeclarators[b].function->addThisParameter(type, intermediate.implicitThisName);
    }

    // All member functions get parsed inside the class/struct namespace and with the
    // class/struct members in a symbol-table level.
    parseContext.pushNamespace(structName);
    parseContext.pushThisScope(type, functionDeclarators);
    bool deferredSuccess = true;
    for (int b = 0; b < (int)functionDeclarators.size() && deferredSuccess; ++b) {
        // parse body
        pushTokenStream(functionDeclarators[b].body);
        if (! acceptFunctionBody(functionDeclarators[b], nodeList))
            deferredSuccess = false;
        popTokenStream();
    }
    parseContext.popThisScope();
    parseContext.popNamespace();

    return deferredSuccess;
}